

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int relocatePage(BtShared *pBt,MemPage *pDbPage,u8 eType,Pgno iPtrPage,Pgno iFreePage,int isCommit)

{
  u16 *puVar1;
  ushort uVar2;
  uint iFrom;
  Pgno newPgno;
  Pager *pPager;
  PgHdr *pPg;
  MemPage *pPage;
  int iVar3;
  DbPage *p;
  undefined8 uVar4;
  Pgno i;
  uint uVar5;
  long in_FS_OFFSET;
  int local_44;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iFrom = pDbPage->pgno;
  if (iFrom < 3) {
    uVar4 = 0x123c8;
LAB_00140e18:
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar4,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    iVar3 = 0xb;
  }
  else {
    pPager = pBt->pPager;
    pPg = pDbPage->pDbPage;
    if ((pPager->tempFile != '\0') && (iVar3 = sqlite3PagerWrite(pPg), iVar3 != 0))
    goto LAB_00141033;
    uVar2 = pPg->flags;
    if ((uVar2 & 2) != 0) {
      iVar3 = subjournalPageIfRequired(pPg);
      if (iVar3 != 0) goto LAB_00141033;
      uVar2 = pPg->flags;
    }
    i = 0;
    if ((isCommit == 0) && (i = 0, (uVar2 & 8) != 0)) {
      i = pPg->pgno;
    }
    pPg->flags = uVar2 & 0xfff7;
    p = sqlite3PagerLookup(pPager,iFreePage);
    if (p != (DbPage *)0x0) {
      if (1 < p->nRef) {
        sqlite3PagerUnrefNotNull(p);
        uVar4 = 0xfc16;
        goto LAB_00140e18;
      }
      pPg->flags = pPg->flags | p->flags & 8;
      if (pPager->tempFile == '\0') {
        sqlite3PcacheDrop(p);
      }
      else {
        sqlite3PcacheMove(p,pPager->dbSize + 1);
      }
    }
    newPgno = pPg->pgno;
    sqlite3PcacheMove(pPg,iFreePage);
    sqlite3PcacheMakeDirty(pPg);
    if ((p != (DbPage *)0x0) && (pPager->tempFile != '\0')) {
      sqlite3PcacheMove(p,newPgno);
      sqlite3PagerUnrefNotNull(p);
    }
    if (i != 0) {
      local_40 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
      iVar3 = (*pPager->xGet)(pPager,i,(DbPage **)&local_40,0);
      if (iVar3 != 0) {
        if (i <= pPager->dbOrigSize) {
          sqlite3BitvecClear(pPager->pInJournal,i,pPager->pTmpSpace);
        }
        goto LAB_00141033;
      }
      puVar1 = (u16 *)((long)local_40->apOvfl + 0xc);
      *puVar1 = *puVar1 | 8;
      sqlite3PcacheMakeDirty((PgHdr *)local_40);
      sqlite3PagerUnrefNotNull((DbPage *)local_40);
    }
    local_44 = 0;
    pDbPage->pgno = iFreePage;
    if ((eType & 0xfb) == 1) {
      iVar3 = setChildPtrmaps(pDbPage);
      if ((iVar3 != 0) || (iVar3 = 0, eType == '\x01')) goto LAB_00141033;
    }
    else {
      uVar5 = *(uint *)pDbPage->aData;
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      if ((uVar5 != 0) &&
         (ptrmapPut(pBt,uVar5,'\x04',iFreePage,&local_44), iVar3 = local_44, local_44 != 0))
      goto LAB_00141033;
    }
    local_40 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = btreeGetPage(pBt,iPtrPage,&local_40,0);
    pPage = local_40;
    if (iVar3 == 0) {
      iVar3 = sqlite3PagerWrite(local_40->pDbPage);
      if (iVar3 == 0) {
        iVar3 = modifyPagePointer(pPage,iFrom,iFreePage,eType);
        local_44 = iVar3;
        sqlite3PagerUnrefNotNull(pPage->pDbPage);
        if (iVar3 == 0) {
          ptrmapPut(pBt,iFreePage,eType,iPtrPage,&local_44);
          iVar3 = local_44;
        }
      }
      else {
        sqlite3PagerUnrefNotNull(pPage->pDbPage);
      }
    }
  }
LAB_00141033:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar3;
}

Assistant:

static int relocatePage(
  BtShared *pBt,           /* Btree */
  MemPage *pDbPage,        /* Open page to move */
  u8 eType,                /* Pointer map 'type' entry for pDbPage */
  Pgno iPtrPage,           /* Pointer map 'page-no' entry for pDbPage */
  Pgno iFreePage,          /* The location to move pDbPage to */
  int isCommit             /* isCommit flag passed to sqlite3PagerMovepage */
){
  MemPage *pPtrPage;   /* The page that contains a pointer to pDbPage */
  Pgno iDbPage = pDbPage->pgno;
  Pager *pPager = pBt->pPager;
  int rc;

  assert( eType==PTRMAP_OVERFLOW2 || eType==PTRMAP_OVERFLOW1 ||
      eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE );
  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( pDbPage->pBt==pBt );
  if( iDbPage<3 ) return SQLITE_CORRUPT_BKPT;

  /* Move page iDbPage from its current location to page number iFreePage */
  TRACE(("AUTOVACUUM: Moving %u to free page %u (ptr page %u type %u)\n",
      iDbPage, iFreePage, iPtrPage, eType));
  rc = sqlite3PagerMovepage(pPager, pDbPage->pDbPage, iFreePage, isCommit);
  if( rc!=SQLITE_OK ){
    return rc;
  }
  pDbPage->pgno = iFreePage;

  /* If pDbPage was a btree-page, then it may have child pages and/or cells
  ** that point to overflow pages. The pointer map entries for all these
  ** pages need to be changed.
  **
  ** If pDbPage is an overflow page, then the first 4 bytes may store a
  ** pointer to a subsequent overflow page. If this is the case, then
  ** the pointer map needs to be updated for the subsequent overflow page.
  */
  if( eType==PTRMAP_BTREE || eType==PTRMAP_ROOTPAGE ){
    rc = setChildPtrmaps(pDbPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
  }else{
    Pgno nextOvfl = get4byte(pDbPage->aData);
    if( nextOvfl!=0 ){
      ptrmapPut(pBt, nextOvfl, PTRMAP_OVERFLOW2, iFreePage, &rc);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  /* Fix the database pointer on page iPtrPage that pointed at iDbPage so
  ** that it points at iFreePage. Also fix the pointer map entry for
  ** iPtrPage.
  */
  if( eType!=PTRMAP_ROOTPAGE ){
    rc = btreeGetPage(pBt, iPtrPage, &pPtrPage, 0);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    rc = sqlite3PagerWrite(pPtrPage->pDbPage);
    if( rc!=SQLITE_OK ){
      releasePage(pPtrPage);
      return rc;
    }
    rc = modifyPagePointer(pPtrPage, iDbPage, iFreePage, eType);
    releasePage(pPtrPage);
    if( rc==SQLITE_OK ){
      ptrmapPut(pBt, iFreePage, eType, iPtrPage, &rc);
    }
  }
  return rc;
}